

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPExternalTransmitter::WaitForIncomingData
          (RTPExternalTransmitter *this,RTPTime *delay,bool *dataavailable)

{
  list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_> *plVar1;
  uint3 in_EAX;
  int iVar2;
  int iVar3;
  int8_t isset;
  undefined8 uStack_28;
  SocketType abortSock;
  
  iVar2 = -0x97;
  if (((this->init == true) && (iVar2 = -0x96, this->created == true)) &&
     (iVar2 = -0x8d, this->waitingfordata == false)) {
    this->waitingfordata = true;
    plVar1 = &this->rawpacketlist;
    if ((this->rawpacketlist).
        super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>._M_impl.
        _M_node.super__List_node_base._M_next == (_List_node_base *)plVar1) {
      iVar3 = 0;
      uStack_28 = CONCAT44((this->m_abortDesc).m_descriptors[0],(uint)in_EAX);
      iVar2 = RTPSelect(&abortSock,&isset,1,(RTPTime)delay->m_t);
      this->waitingfordata = false;
      if ((-1 < iVar2) && (iVar2 = iVar3, this->created == true)) {
        if (isset != '\0') {
          RTPAbortDescriptors::ClearAbortSignal(&this->m_abortDesc);
        }
        if (dataavailable != (bool *)0x0) {
          *dataavailable =
               (plVar1->
               super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>).
               _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)plVar1;
        }
      }
    }
    else {
      if (dataavailable != (bool *)0x0) {
        *dataavailable = true;
      }
      this->waitingfordata = false;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int RTPExternalTransmitter::WaitForIncomingData(const RTPTime &delay,bool *dataavailable)
{
	if (!init)
		return ERR_RTP_EXTERNALTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_NOTCREATED;
	}
	if (waitingfordata)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_ALREADYWAITING;
	}
	
	waitingfordata = true;

	if (!rawpacketlist.empty())
	{
		if (dataavailable != 0)
			*dataavailable = true;
		waitingfordata = false;
		MAINMUTEX_UNLOCK
		return 0;
	}
	
	WAITMUTEX_LOCK
	MAINMUTEX_UNLOCK

	int8_t isset = 0;
	SocketType abortSock = m_abortDesc.GetAbortSocket();
	int status = RTPSelect(&abortSock, &isset, 1, delay);
	if (status < 0)
	{
		MAINMUTEX_LOCK
		waitingfordata = false;
		MAINMUTEX_UNLOCK
		WAITMUTEX_UNLOCK
		return status;
	}
	
	MAINMUTEX_LOCK
	waitingfordata = false;
	if (!created) // destroy called
	{
		MAINMUTEX_UNLOCK;
		WAITMUTEX_UNLOCK
		return 0;
	}
		
	// if aborted, read from abort buffer
	if (isset)
		m_abortDesc.ClearAbortSignal();

	if (dataavailable != 0)
	{
		if (rawpacketlist.empty())
			*dataavailable = false;
		else
			*dataavailable = true;
	}	
	
	MAINMUTEX_UNLOCK
	WAITMUTEX_UNLOCK
	return 0;
}